

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O3

void Map_ManCreateNodeDelays(Map_Man_t *p,int LogFan)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  Map_NodeVec_t *pMVar5;
  double dVar6;
  
  if (p->pNodeDelays == (float *)0x0) {
    pMVar5 = p->vMapObjs;
    iVar2 = pMVar5->nSize;
    pfVar3 = (float *)calloc((long)iVar2,4);
    p->pNodeDelays = pfVar3;
    if (0 < (long)iVar2) {
      lVar4 = 0;
      do {
        iVar2 = pMVar5->pArray[lVar4]->nRefs;
        if (iVar2 != 0) {
          fVar1 = (p->pSuperLib->tDelayInv).Worst;
          dVar6 = log((double)iVar2);
          p->pNodeDelays[lVar4] = (float)(dVar6 * (double)fVar1 * (double)LogFan * 0.014426);
          pMVar5 = p->vMapObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pMVar5->nSize);
    }
    return;
  }
  __assert_fail("p->pNodeDelays == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCreate.c"
                ,0x122,"void Map_ManCreateNodeDelays(Map_Man_t *, int)");
}

Assistant:

void Map_ManCreateNodeDelays( Map_Man_t * p, int LogFan )
{
    Map_Node_t * pNode;
    int k;
    assert( p->pNodeDelays == NULL );
    p->pNodeDelays = ABC_CALLOC( float, p->vMapObjs->nSize );
    for ( k = 0; k < p->vMapObjs->nSize; k++ )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefs == 0 )
            continue;
        p->pNodeDelays[k] = 0.014426 * LogFan * p->pSuperLib->tDelayInv.Worst * log( (double)pNode->nRefs ); // 1.4426 = 1/ln(2)
//        printf( "%d = %d (%.2f)  ", k, pNode->nRefs, p->pNodeDelays[k] );
    }
//    printf( "\n" );
}